

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::init
          (UploadWaitDrawCase *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  deUint64 *pdVar3;
  TargetBuffer TVar4;
  uint uVar5;
  pointer pVVar6;
  pointer puVar7;
  pointer pSVar8;
  pointer pRVar9;
  undefined8 uVar10;
  deUint64 dVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  deUint64 dVar14;
  deUint64 dVar15;
  int iVar16;
  undefined4 extraout_var;
  RenderTarget *pRVar17;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  pointer pSVar18;
  pointer pRVar19;
  NotSupportedError *this_00;
  long *plVar20;
  size_type *psVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  int numBytes;
  size_t sVar23;
  long lVar24;
  int iVar25;
  char *pcVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  value_type *__val_1;
  ulong uVar33;
  value_type *__val;
  bool bVar34;
  LayeredGridSpec scene_1;
  LayeredGridSpec scene;
  string local_260;
  int local_240 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  ObjectTraits *pOStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  
  iVar16 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[3])();
  lVar24 = CONCAT44(extraout_var,iVar16);
  TVar4 = this->m_targetBuffer;
  RenderPerformanceTestBase::init(&this->super_RenderPerformanceTestBase,ctx);
  pRVar17 = Context::getRenderTarget
                      ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
  if ((pRVar17->m_width < 0x80) ||
     (pRVar17 = Context::getRenderTarget
                          ((this->super_RenderPerformanceTestBase).super_TestCase.m_context),
     pRVar17->m_height < 0x80)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_240[1] = 0x80;
    de::toString<int>(&local_218,local_240 + 1);
    std::operator+(&local_1d8,"Test case requires ",&local_218);
    plVar20 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    local_238._M_dataplus._M_p = (pointer)*plVar20;
    psVar21 = (size_type *)(plVar20 + 2);
    if ((size_type *)local_238._M_dataplus._M_p == psVar21) {
      local_238.field_2._M_allocated_capacity = *psVar21;
      local_238.field_2._8_8_ = plVar20[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar21;
    }
    local_238._M_string_length = plVar20[1];
    *plVar20 = (long)psVar21;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    local_240[0] = 0x80;
    de::toString<int>(&local_1f8,local_240);
    std::operator+(&local_260,&local_238,&local_1f8);
    plVar20 = (long *)std::__cxx11::string::append((char *)&local_260);
    local_1b8 = (undefined1  [8])*plVar20;
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar20 + 2);
    if (local_1b8 == (undefined1  [8])paVar22) {
      local_1a8[0]._0_8_ = paVar22->_M_allocated_capacity;
      local_1a8[0]._8_8_ = plVar20[3];
      local_1b8 = (undefined1  [8])local_1a8;
    }
    else {
      local_1a8[0]._0_8_ = paVar22->_M_allocated_capacity;
    }
    pOStack_1b0 = (ObjectTraits *)plVar20[1];
    *plVar20 = (long)paVar22;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b8);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar24 + 0x1a00))(0,0,0x80,0x80);
  (**(code **)(lVar24 + 0x120))(0x302,0x303);
  (**(code **)(lVar24 + 0x100))(0x8006);
  (**(code **)(lVar24 + 0x5e0))(0xbe2);
  local_1b8 = (undefined1  [8])0x5d0000005d;
  pOStack_1b0 = (ObjectTraits *)CONCAT44(pOStack_1b0._4_4_,5);
  generateLayeredGridVertexAttribData4C4V(&this->m_vertexData,(LayeredGridSpec *)local_1b8);
  generateLayeredGridIndexData(&this->m_indexData,(LayeredGridSpec *)local_1b8);
  this->m_numVertices = 0x3f58e;
  if (this->m_bufferState == BUFFERSTATE_EXISTING) {
    (**(code **)(lVar24 + 0x6c8))(1,&this->m_vertexBuffer);
    (**(code **)(lVar24 + 0x40))(0x8892,this->m_vertexBuffer);
    pVVar6 = (this->m_vertexData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar24 + 0x150))
              (0x8892,(long)(this->m_vertexData).
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6,pVVar6,0x88e4)
    ;
    if (this->m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
      (**(code **)(lVar24 + 0x6c8))(1,&this->m_indexBuffer);
      (**(code **)(lVar24 + 0x40))(0x8893,this->m_indexBuffer);
      puVar7 = (this->m_indexData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar24 + 0x150))
                (0x8893,(long)(this->m_indexData).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar7,puVar7,0x88e4
                );
    }
    RenderPerformanceTestBase::setupVertexAttribs(&this->super_RenderPerformanceTestBase);
    if (this->m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
      (**(code **)(lVar24 + 0x568))(4,this->m_numVertices,0x1405,0);
    }
    else if (this->m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) goto LAB_01356b31;
  }
  else if ((this->m_bufferState == BUFFERSTATE_NEW) &&
          (this->m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)) {
    if (this->m_targetBuffer == TARGETBUFFER_INDEX) {
      (**(code **)(lVar24 + 0x6c8))(1,&this->m_vertexBuffer);
      (**(code **)(lVar24 + 0x40))(0x8892,this->m_vertexBuffer);
      pVVar6 = (this->m_vertexData).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar24 + 0x150))
                (0x8892,(long)(this->m_vertexData).
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6,pVVar6,
                 0x88e4);
      RenderPerformanceTestBase::setupVertexAttribs(&this->super_RenderPerformanceTestBase);
LAB_01356b31:
      (**(code **)(lVar24 + 0x538))(4,0,this->m_numVertices);
    }
    else if (this->m_targetBuffer == TARGETBUFFER_VERTEX) {
      iVar16 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
                 _vptr_RenderContext[3])();
      traits = glu::objectTraits(OBJECTTYPE_BUFFER);
      glu::ObjectWrapper::ObjectWrapper
                ((ObjectWrapper *)local_1b8,(Functions *)CONCAT44(extraout_var_00,iVar16),traits);
      (**(code **)(lVar24 + 0x6c8))(1,&this->m_indexBuffer);
      (**(code **)(lVar24 + 0x40))(0x8892,local_1a8[0]._M_allocated_capacity & 0xffffffff);
      (**(code **)(lVar24 + 0x40))(0x8893,this->m_indexBuffer);
      pVVar6 = (this->m_vertexData).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar24 + 0x150))
                (0x8892,(long)(this->m_vertexData).
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6,pVVar6,
                 0x88e4);
      puVar7 = (this->m_indexData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar24 + 0x150))
                (0x8893,(long)(this->m_indexData).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar7,puVar7,0x88e4
                );
      RenderPerformanceTestBase::setupVertexAttribs(&this->super_RenderPerformanceTestBase);
      (**(code **)(lVar24 + 0x568))(4,this->m_numVertices,0x1405,0);
      glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_1b8);
    }
  }
  local_1b8 = (undefined1  [8])0x0;
  pOStack_1b0 = (ObjectTraits *)0x0;
  local_1a8[0]._M_allocated_capacity = (pointer)0x0;
  local_260._M_dataplus._M_p = (char *)0x2800000028;
  local_260._M_string_length._0_4_ = 5;
  generateLayeredGridVertexAttribData4C4V
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1b8,
             (LayeredGridSpec *)&local_260);
  (**(code **)(lVar24 + 0x6c8))(1,&this->m_miscBuffer);
  (**(code **)(lVar24 + 0x40))(0x8892,this->m_miscBuffer);
  (**(code **)(lVar24 + 0x150))(0x8892,(long)pOStack_1b0 - (long)local_1b8,local_1b8,0x88e4);
  this->m_numMiscVertices = 48000;
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8,local_1a8[0]._M_allocated_capacity - (long)local_1b8);
  }
  uVar30 = (ulong)((this->m_numMaxSwaps + 1) * this->m_numSamplesPerSwap);
  pSVar18 = (this->m_samples).
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar8 = (this->m_samples).
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar24 = (long)pSVar8 - (long)pSVar18;
  uVar33 = lVar24 >> 4;
  uVar31 = uVar30 - uVar33;
  if (uVar30 < uVar33 || uVar31 == 0) {
    if ((uVar30 < uVar33) && (pSVar18 = pSVar18 + uVar30, pSVar8 != pSVar18)) {
      (this->m_samples).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar18;
    }
  }
  else if ((ulong)((long)(this->m_samples).
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar8 >> 4) <
           uVar31) {
    if ((uVar33 ^ 0x7ffffffffffffff) < uVar31) goto LAB_013572f1;
    uVar28 = uVar31;
    if (uVar31 < uVar33) {
      uVar28 = uVar33;
    }
    uVar28 = uVar28 + uVar33;
    if (0x7fffffffffffffe < uVar28) {
      uVar28 = 0x7ffffffffffffff;
    }
    pSVar18 = (pointer)operator_new(uVar28 * 0x10);
    puVar1 = (undefined8 *)((long)pSVar18 + lVar24);
    *(undefined8 *)((long)pSVar18 + lVar24) = 0;
    ((undefined8 *)((long)pSVar18 + lVar24))[1] = 0;
    if (uVar31 != 1) {
      lVar24 = 0x10;
      do {
        uVar10 = puVar1[1];
        *(undefined8 *)((long)puVar1 + lVar24) = *puVar1;
        ((undefined8 *)((long)puVar1 + lVar24))[1] = uVar10;
        lVar24 = lVar24 + 0x10;
      } while (uVar30 * 0x10 + uVar33 * -0x10 != lVar24);
    }
    pSVar8 = (this->m_samples).
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar23 = (long)(this->m_samples).
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8;
    if (0 < (long)sVar23) {
      memmove(pSVar18,pSVar8,sVar23);
    }
    if (pSVar8 != (pointer)0x0) {
      operator_delete(pSVar8,(long)(this->m_samples).
                                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar8
                     );
    }
    (this->m_samples).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = pSVar18;
    (this->m_samples).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(puVar1 + uVar31 * 2);
    (this->m_samples).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar18 + uVar28;
  }
  else {
    *(undefined8 *)pSVar8 = 0;
    pSVar8->uploadCallEndTime = 0;
    if (uVar31 - 1 == 0) {
      pSVar18 = pSVar8 + 1;
    }
    else {
      pSVar18 = pSVar8 + uVar31;
      if ((uVar31 - 1 & 0xfffffffffffffff) != 0) {
        lVar24 = 0x10;
        do {
          dVar11 = pSVar8->uploadCallEndTime;
          puVar1 = (undefined8 *)((long)&pSVar8->numFrames + lVar24);
          *puVar1 = *(undefined8 *)pSVar8;
          puVar1[1] = dVar11;
          lVar24 = lVar24 + 0x10;
        } while (uVar30 * 0x10 + uVar33 * -0x10 != lVar24);
      }
    }
    (this->m_samples).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar18;
  }
  uVar33 = (ulong)((this->m_numMaxSwaps + 1) * this->m_numSamplesPerSwap);
  pRVar19 = (this->m_results).
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar9 = (this->m_results).
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar32 = (long)pRVar9 - (long)pRVar19;
  lVar24 = lVar32 >> 3;
  uVar30 = lVar24 * -0x3333333333333333;
  uVar31 = uVar33 + lVar24 * 0x3333333333333333;
  if (uVar33 < uVar30 || uVar31 == 0) {
    if ((uVar33 >= uVar30) || (pRVar19 = pRVar19 + uVar33, pRVar9 == pRVar19)) goto LAB_01356f78;
  }
  else {
    if ((ulong)(((long)(this->m_results).
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar9 >> 3) *
               -0x3333333333333333) < uVar31) {
      if (lVar24 * 0x3333333333333333 + 0x333333333333333U < uVar31) {
LAB_013572f1:
        std::__throw_length_error("vector::_M_default_append");
      }
      uVar28 = uVar31;
      if (uVar31 <= uVar30 && uVar30 - uVar31 != 0) {
        uVar28 = uVar30;
      }
      uVar28 = uVar28 + uVar30;
      if (0x333333333333332 < uVar28) {
        uVar28 = 0x333333333333333;
      }
      pRVar19 = (pointer)operator_new(uVar28 * 0x28);
      puVar1 = (undefined8 *)((long)pRVar19 + lVar32);
      *(undefined8 *)((long)pRVar19 + lVar32) = 0;
      ((undefined8 *)((long)pRVar19 + lVar32))[1] = 0;
      puVar2 = (undefined8 *)((long)pRVar19 + lVar32 + 0x10);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)((long)pRVar19 + lVar32 + 0x20) = 0;
      if (uVar31 != 1) {
        lVar32 = 0x28;
        do {
          *(undefined8 *)((long)puVar1 + lVar32 + 0x20) = puVar1[4];
          uVar10 = *puVar1;
          uVar12 = puVar1[1];
          uVar13 = puVar1[3];
          puVar2 = (undefined8 *)((long)puVar1 + lVar32 + 0x10);
          *puVar2 = puVar1[2];
          puVar2[1] = uVar13;
          *(undefined8 *)((long)puVar1 + lVar32) = uVar10;
          ((undefined8 *)((long)puVar1 + lVar32))[1] = uVar12;
          lVar32 = lVar32 + 0x28;
        } while (uVar33 * 0x28 + lVar24 * -8 != lVar32);
      }
      pRVar9 = (this->m_results).
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar23 = (long)(this->m_results).
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9;
      if (0 < (long)sVar23) {
        memmove(pRVar19,pRVar9,sVar23);
      }
      if (pRVar9 != (pointer)0x0) {
        operator_delete(pRVar9,(long)(this->m_results).
                                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pRVar9);
      }
      (this->m_results).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
      ._M_impl.super__Vector_impl_data._M_start = pRVar19;
      (this->m_results).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(puVar1 + uVar31 * 5);
      (this->m_results).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar19 + uVar28;
      goto LAB_01356f78;
    }
    pRVar9->readDuration = 0;
    pRVar9->renderReadDuration = 0;
    pRVar9->uploadDuration = 0;
    pRVar9->renderDuration = 0;
    pRVar9->timeBeforeUse = 0;
    if (uVar31 - 1 == 0) {
      pRVar19 = pRVar9 + 1;
    }
    else {
      pRVar19 = pRVar9 + uVar31;
      if ((uVar31 - 1) * 0x28 != 0) {
        lVar32 = 0x28;
        do {
          *(deUint64 *)((long)&pRVar9->timeBeforeUse + lVar32) = pRVar9->timeBeforeUse;
          dVar11 = pRVar9->uploadDuration;
          dVar14 = pRVar9->renderDuration;
          dVar15 = pRVar9->renderReadDuration;
          pdVar3 = (deUint64 *)((long)&pRVar9->readDuration + lVar32);
          *pdVar3 = pRVar9->readDuration;
          pdVar3[1] = dVar15;
          pdVar3 = (deUint64 *)((long)&pRVar9->uploadDuration + lVar32);
          *pdVar3 = dVar11;
          pdVar3[1] = dVar14;
          lVar32 = lVar32 + 0x28;
        } while (uVar33 * 0x28 + lVar24 * -8 != lVar32);
      }
    }
  }
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
  ._M_impl.super__Vector_impl_data._M_finish = pRVar19;
LAB_01356f78:
  pSVar18 = (this->m_samples).
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (-1 < this->m_numMaxSwaps) {
    uVar5 = this->m_numSamplesPerSwap;
    iVar25 = this->m_numMaxSwaps + 1;
    iVar16 = 1;
    if (1 < iVar25) {
      iVar16 = iVar25;
    }
    iVar25 = 0;
    iVar27 = 0;
    do {
      uVar30 = (ulong)uVar5;
      iVar29 = iVar25;
      if (0 < (int)uVar5) {
        do {
          pSVar18[iVar29].numFrames = iVar27;
          iVar29 = iVar29 + 1;
          uVar30 = uVar30 - 1;
        } while (uVar30 != 0);
      }
      iVar27 = iVar27 + 1;
      iVar25 = iVar25 + uVar5;
    } while (iVar27 != iVar16);
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&this->m_iterationOrder,
             (long)(this->m_samples).
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar18 >> 4);
  generateTwoPassRandomIterationOrder
            (&this->m_iterationOrder,
             (int)((ulong)((long)(this->m_samples).
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_samples).
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4));
  local_1b8 = (undefined1  [8])
              ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pOStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pOStack_1b0,"Measuring time used in ",0x17);
  bVar34 = this->m_drawMethod != DRAWMETHOD_DRAW_ARRAYS;
  pcVar26 = "Draw method: drawElements";
  if (!bVar34) {
    pcVar26 = "Draw method: drawArrays";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pOStack_1b0,pcVar26 + 0xd,(ulong)bVar34 * 2 + 10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pOStack_1b0," and readPixels call.\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pOStack_1b0,
             "Drawing using a buffer that has been uploaded N frames ago. Testing with N within range [0, "
             ,0x5c);
  std::ostream::operator<<((ostringstream *)&pOStack_1b0,this->m_numMaxSwaps);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pOStack_1b0,"].\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pOStack_1b0,"Uploaded buffer is a ",0x15);
  bVar34 = this->m_targetBuffer == TARGETBUFFER_VERTEX;
  pcVar26 = "index";
  if (bVar34) {
    pcVar26 = "vertex attribute";
  }
  lVar24 = 5;
  if (bVar34) {
    lVar24 = 0x10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pOStack_1b0,pcVar26,lVar24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pOStack_1b0," buffer.\n",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pOStack_1b0,"Uploading using ",0x10);
  if ((ulong)this->m_uploadMethod < 3) {
    pcVar26 = *(char **)(&DAT_0215aa30 + (ulong)this->m_uploadMethod * 8);
    sVar23 = strlen(pcVar26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pOStack_1b0,pcVar26,sVar23);
  }
  else {
    std::ios::clear((int)(ostringstream *)&pOStack_1b0 + (int)pOStack_1b0[-1].name);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pOStack_1b0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pOStack_1b0,"Upload size is ",0xf);
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_260,
             (_anonymous_namespace_ *)
             (ulong)(uint)(this->m_numVertices << (TVar4 == TARGETBUFFER_VERTEX) * '\x03' + 2),
             numBytes);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pOStack_1b0,local_260._M_dataplus._M_p,
             CONCAT44(local_260._M_string_length._4_4_,(undefined4)local_260._M_string_length));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pOStack_1b0,".\n",2);
  bVar34 = this->m_bufferState == BUFFERSTATE_EXISTING;
  pcVar26 = ::glcts::fixed_sample_locations_values + 1;
  if (bVar34) {
    pcVar26 = "All test samples use the same buffer object.\n";
  }
  lVar24 = 0x2d;
  if (!bVar34) {
    lVar24 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pOStack_1b0,pcVar26,lVar24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pOStack_1b0,
             "Test result is the number of frames (swaps) required for the render time to stabilize.\n"
             ,0x57);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pOStack_1b0,
             "Assuming combined time used in the draw call and readPixels call is stabilizes to a constant value.\n"
             ,100);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pOStack_1b0);
  iVar16 = std::ios_base::~ios_base(local_140);
  return iVar16;
}

Assistant:

void UploadWaitDrawCase::init (void)
{
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	const int				vertexAttribSize		= (int)sizeof(tcu::Vec4) * 2; // color4, position4
	const int				vertexIndexSize			= (int)sizeof(deUint32);
	const int				vertexUploadDataSize	= (m_targetBuffer == TARGETBUFFER_VERTEX) ? (vertexAttribSize) : (vertexIndexSize);

	RenderPerformanceTestBase::init();

	// requirements

	if (m_context.getRenderTarget().getWidth() < RENDER_AREA_SIZE ||
		m_context.getRenderTarget().getHeight() < RENDER_AREA_SIZE)
		throw tcu::NotSupportedError("Test case requires " + de::toString<int>(RENDER_AREA_SIZE) + "x" + de::toString<int>(RENDER_AREA_SIZE) + " render target");

	// gl state

	gl.viewport(0, 0, RENDER_AREA_SIZE, RENDER_AREA_SIZE);

	// enable bleding to prevent grid layers from being discarded

	gl.blendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	gl.blendEquation(GL_FUNC_ADD);
	gl.enable(GL_BLEND);

	// scene

	{
		LayeredGridSpec scene;

		// create ~8MB workload with similar characteristics as in the other test
		// => makes comparison to other results more straightforward
		scene.gridWidth = 93;
		scene.gridHeight = 93;
		scene.gridLayers = 5;

		generateLayeredGridVertexAttribData4C4V(m_vertexData, scene);
		generateLayeredGridIndexData(m_indexData, scene);
		m_numVertices = getLayeredGridNumVertices(scene);
	}

	// buffers

	if (m_bufferState == BUFFERSTATE_NEW)
	{
		if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		{
			// reads from two buffers, prepare the static buffer

			if (m_targetBuffer == TARGETBUFFER_VERTEX)
			{
				// index buffer is static, use another vertex buffer to keep original buffer in unused state
				const glu::Buffer vertexCopyBuffer(m_context.getRenderContext());

				gl.genBuffers(1, &m_indexBuffer);
				gl.bindBuffer(GL_ARRAY_BUFFER, *vertexCopyBuffer);
				gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);
				gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(m_vertexData.size() * sizeof(tcu::Vec4)), &m_vertexData[0], GL_STATIC_DRAW);
				gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(m_indexData.size() * sizeof(deUint32)), &m_indexData[0], GL_STATIC_DRAW);

				setupVertexAttribs();
				gl.drawElements(GL_TRIANGLES, m_numVertices, GL_UNSIGNED_INT, DE_NULL);
			}
			else if (m_targetBuffer == TARGETBUFFER_INDEX)
			{
				// vertex buffer is static
				gl.genBuffers(1, &m_vertexBuffer);
				gl.bindBuffer(GL_ARRAY_BUFFER, m_vertexBuffer);
				gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(m_vertexData.size() * sizeof(tcu::Vec4)), &m_vertexData[0], GL_STATIC_DRAW);

				setupVertexAttribs();
				gl.drawArrays(GL_TRIANGLES, 0, m_numVertices);
			}
			else
				DE_ASSERT(false);
		}
	}
	else if (m_bufferState == BUFFERSTATE_EXISTING)
	{
		const glw::GLenum vertexUsage	= (m_targetBuffer == TARGETBUFFER_VERTEX) ? (GL_STATIC_DRAW) : (GL_STATIC_DRAW);
		const glw::GLenum indexUsage	= (m_targetBuffer == TARGETBUFFER_INDEX) ? (GL_STATIC_DRAW) : (GL_STATIC_DRAW);

		gl.genBuffers(1, &m_vertexBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_vertexBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(m_vertexData.size() * sizeof(tcu::Vec4)), &m_vertexData[0], vertexUsage);

		if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		{
			gl.genBuffers(1, &m_indexBuffer);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(m_indexData.size() * sizeof(deUint32)), &m_indexData[0], indexUsage);
		}

		setupVertexAttribs();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, m_numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, m_numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);
	}
	else
		DE_ASSERT(false);

	// misc draw buffer
	{
		std::vector<tcu::Vec4>	vertexData;
		LayeredGridSpec			scene;

		// create ~1.5MB workload with similar characteristics
		scene.gridWidth = 40;
		scene.gridHeight = 40;
		scene.gridLayers = 5;

		generateLayeredGridVertexAttribData4C4V(vertexData, scene);

		gl.genBuffers(1, &m_miscBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_miscBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(sizeof(tcu::Vec4) * vertexData.size()), &vertexData[0], GL_STATIC_DRAW);

		m_numMiscVertices = getLayeredGridNumVertices(scene);
	}

	// iterations
	{
		m_samples.resize((m_numMaxSwaps+1) * m_numSamplesPerSwap);
		m_results.resize((m_numMaxSwaps+1) * m_numSamplesPerSwap);

		for (int numSwaps = 0; numSwaps <= m_numMaxSwaps; ++numSwaps)
		for (int sampleNdx = 0; sampleNdx < m_numSamplesPerSwap; ++sampleNdx)
		{
			const int index = numSwaps*m_numSamplesPerSwap + sampleNdx;

			m_samples[index].numFrames = numSwaps;
		}

		m_iterationOrder.resize(m_samples.size());
		generateTwoPassRandomIterationOrder(m_iterationOrder, (int)m_samples.size());
	}

	// log
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Measuring time used in " << ((m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements")) << " and readPixels call.\n"
		<< "Drawing using a buffer that has been uploaded N frames ago. Testing with N within range [0, " << m_numMaxSwaps << "].\n"
		<< "Uploaded buffer is a " << ((m_targetBuffer == TARGETBUFFER_VERTEX) ? ("vertex attribute") : ("index")) << " buffer.\n"
		<< "Uploading using "
			<< ((m_uploadMethod == UPLOADMETHOD_BUFFER_DATA)		? ("bufferData")																							:
				(m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA)	? ("bufferSubData")																							:
				(m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE)	? ("mapBufferRange, flags = GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT | GL_MAP_UNSYNCHRONIZED_BIT")	:
				((const char*)DE_NULL))
			<< "\n"
		<< "Upload size is " << getHumanReadableByteSize(m_numVertices * vertexUploadDataSize) << ".\n"
		<< ((m_bufferState == BUFFERSTATE_EXISTING) ? ("All test samples use the same buffer object.\n") : (""))
		<< "Test result is the number of frames (swaps) required for the render time to stabilize.\n"
		<< "Assuming combined time used in the draw call and readPixels call is stabilizes to a constant value.\n"
		<< tcu::TestLog::EndMessage;
}